

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void MouseCursorPosCallback(GLFWwindow *window,double x,double y)

{
  GestureEvent event;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  GestureEvent gestureEvent;
  undefined8 auStackY_d8 [3];
  undefined1 in_stack_ffffffffffffff40 [88];
  undefined8 uVar4;
  undefined4 uVar5;
  float fVar6;
  
  CORE.Input.Mouse.currentPosition.x = (float)x;
  CORE.Input.Mouse.currentPosition.y = (float)y;
  CORE.Input.Touch.position[0].y = CORE.Input.Mouse.currentPosition.y;
  CORE.Input.Touch.position[0].x = CORE.Input.Mouse.currentPosition.x;
  fVar6 = 0.0;
  uVar4 = 0x100000002;
  uVar5 = 0;
  puVar2 = (undefined8 *)&stack0xffffffffffffff98;
  puVar3 = auStackY_d8;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + 1;
    puVar3 = puVar3 + 1;
  }
  event.position[6].x = (float)(int)uVar4;
  event.position[6].y = (float)(int)((ulong)uVar4 >> 0x20);
  event.touchAction = in_stack_ffffffffffffff40._0_4_;
  event.pointCount = in_stack_ffffffffffffff40._4_4_;
  event.pointId[0] = in_stack_ffffffffffffff40._8_4_;
  event.pointId[1] = in_stack_ffffffffffffff40._12_4_;
  event.pointId[2] = in_stack_ffffffffffffff40._16_4_;
  event.pointId[3] = in_stack_ffffffffffffff40._20_4_;
  event.pointId[4] = in_stack_ffffffffffffff40._24_4_;
  event.pointId[5] = in_stack_ffffffffffffff40._28_4_;
  event.pointId[6] = in_stack_ffffffffffffff40._32_4_;
  event.pointId[7] = in_stack_ffffffffffffff40._36_4_;
  event.position[0].x = (float)(int)in_stack_ffffffffffffff40._40_8_;
  event.position[0].y = (float)(int)((ulong)in_stack_ffffffffffffff40._40_8_ >> 0x20);
  event.position[1].x = (float)(int)in_stack_ffffffffffffff40._48_8_;
  event.position[1].y = (float)(int)((ulong)in_stack_ffffffffffffff40._48_8_ >> 0x20);
  event.position[2].x = (float)(int)in_stack_ffffffffffffff40._56_8_;
  event.position[2].y = (float)(int)((ulong)in_stack_ffffffffffffff40._56_8_ >> 0x20);
  event.position[3].x = (float)(int)in_stack_ffffffffffffff40._64_8_;
  event.position[3].y = (float)(int)((ulong)in_stack_ffffffffffffff40._64_8_ >> 0x20);
  event.position[4].x = (float)(int)in_stack_ffffffffffffff40._72_8_;
  event.position[4].y = (float)(int)((ulong)in_stack_ffffffffffffff40._72_8_ >> 0x20);
  event.position[5].x = (float)(int)in_stack_ffffffffffffff40._80_8_;
  event.position[5].y = (float)(int)((ulong)in_stack_ffffffffffffff40._80_8_ >> 0x20);
  event.position[7].x = (float)uVar5;
  event.position[7].y = fVar6;
  ProcessGestureEvent(event);
  return;
}

Assistant:

static void MouseCursorPosCallback(GLFWwindow *window, double x, double y)
{
    CORE.Input.Mouse.currentPosition.x = (float)x;
    CORE.Input.Mouse.currentPosition.y = (float)y;
    CORE.Input.Touch.position[0] = CORE.Input.Mouse.currentPosition;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    gestureEvent.touchAction = TOUCH_ACTION_MOVE;

    // Assign a pointer ID
    gestureEvent.pointId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = CORE.Input.Touch.position[0];

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures-system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}